

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator_std_impl.c
# Opt level: O3

memory_allocator_impl memory_allocator_std_create(void *ctx)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)(**ctx)(0x18);
  if (puVar2 != (undefined8 *)0x0) {
    uVar1 = *(undefined8 *)((long)ctx + 8);
    *puVar2 = *ctx;
    puVar2[1] = uVar1;
    puVar2[2] = *(undefined8 *)((long)ctx + 0x10);
  }
  return puVar2;
}

Assistant:

memory_allocator_impl memory_allocator_std_create(void *ctx)
{
	memory_allocator_std_ctx std_ctx = (memory_allocator_std_ctx)ctx;

	memory_allocator_std_impl std_impl = std_ctx->malloc(sizeof(struct memory_allocator_std_impl_type));

	if (std_impl == NULL)
	{
		return NULL;
	}

	std_impl->malloc = std_ctx->malloc;
	std_impl->realloc = std_ctx->realloc;
	std_impl->free = std_ctx->free;

	return (memory_allocator_impl)std_impl;
}